

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar4 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar6 = uVar4 + 1;
  uVar1 = pPg->pBt->usableSize;
  uVar8 = (uint)(ushort)(*(ushort *)(puVar2 + uVar4 + 1) << 8 | *(ushort *)(puVar2 + uVar4 + 1) >> 8
                        );
  do {
    uVar9 = uVar8;
    if ((int)(uVar1 - 4) < (int)uVar8) break;
    uVar7 = *(ushort *)(puVar2 + (ulong)uVar8 + 2) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar8 + 2) >> 8;
    uVar9 = (uint)uVar7 - nByte;
    if (-1 < (int)uVar9) {
      if ((int)(uVar7 + uVar8) <= (int)uVar1) {
        if (uVar9 < 4) {
          if (0x39 < puVar2[uVar4 + 7]) {
            return (u8 *)0x0;
          }
          *(undefined2 *)(puVar2 + uVar6) = *(undefined2 *)(puVar2 + uVar8);
          puVar2[uVar4 + 7] = puVar2[uVar4 + 7] + (char)uVar9;
        }
        else {
          *(ushort *)(puVar2 + (ulong)uVar8 + 2) = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
        }
        return puVar2 + (uVar9 + uVar8);
      }
      iVar3 = 0xfbdc;
      goto LAB_001330de;
    }
    uVar9 = (uint)(ushort)(*(ushort *)(puVar2 + uVar8) << 8 | *(ushort *)(puVar2 + uVar8) >> 8);
    uVar5 = uVar7 + uVar8;
    uVar6 = (ulong)uVar8;
    uVar8 = uVar9;
  } while (uVar5 <= uVar9);
  if (uVar9 != 0) {
    iVar3 = 0xfbf3;
LAB_001330de:
    iVar3 = sqlite3CorruptError(iVar3);
    *pRc = iVar3;
  }
  return (u8 *)0x0;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;
  u8 * const aData = pPg->aData;
  int iAddr = hdr + 1;
  int pc = get2byte(&aData[iAddr]);
  int x;
  int usableSize = pPg->pBt->usableSize;
  int size;            /* Size of the free slot */

  assert( pc>0 );
  while( pc<=usableSize-4 ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( size+pc > usableSize ){
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
         ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
    if( pc<iAddr+size ) break;
  }
  if( pc ){
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }

  return 0;
}